

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

bool __thiscall QXmlStreamReaderPrivate::scanNData(QXmlStreamReaderPrivate *this)

{
  bool bVar1;
  qsizetype qVar2;
  uint *puVar3;
  
  qVar2 = fastScanSpace(this);
  if (qVar2 != 0) {
    bVar1 = scanString(this,"NDATA",0x24,true);
    if (bVar1) {
      return true;
    }
    puVar3 = QXmlStreamSimpleStack<unsigned_int>::push(&this->putStack);
    *puVar3 = 0x20;
  }
  return false;
}

Assistant:

bool QXmlStreamReaderPrivate::scanNData()
{
    if (fastScanSpace()) {
        if (scanString(spell[NDATA], NDATA))
            return true;
        putChar(' ');
    }
    return false;
}